

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlcrc.c
# Opt level: O2

err_t ReadData(ebml_master *Element,stream *Input,ebml_parser_context *ParserContext,
              bool_t AllowDummyElt,int Scope,size_t DepthCheckCRC)

{
  int iVar1;
  code *pcVar2;
  bool bVar3;
  size_t sVar4;
  filepos_t fVar5;
  long lVar6;
  ebml_crc *Element_00;
  bool_t bVar7;
  filepos_t fVar8;
  filepos_t fVar9;
  ebml_context *Context_00;
  ebml_crc *peVar10;
  stream *psVar11;
  bool bVar12;
  int UpperEltFound;
  uint8_t *CRCData;
  stream *local_a0;
  bool_t local_98;
  ebml_crc *local_90;
  array local_88;
  size_t local_78;
  filepos_t OffSet;
  int local_64;
  size_t local_60;
  long local_58;
  ebml_parser_context Context;
  
  UpperEltFound = 0;
  CRCData = (uint8_t *)0x0;
  local_98 = AllowDummyElt;
  local_60 = DepthCheckCRC;
  NodeTree_Clear((nodetree *)Element);
  (Element->Base).bValueIsSet = '\0';
  if (((Element->Base).DataSize < 1) &&
     (bVar7 = EBML_ElementIsFiniteSize(&Element->Base), bVar7 != 0)) {
    Element_00 = (ebml_crc *)0x0;
    psVar11 = Input;
  }
  else {
    local_64 = Scope;
    if (Input == (stream *)0x0) {
      __assert_fail("(const void*)(Input)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                    ,0x123,
                    "err_t ReadData(ebml_master *, struct stream *, const ebml_parser_context *, bool_t, int, size_t)"
                   );
    }
    pcVar2 = *(code **)((long)(Input->Base).VMT + 0x78);
    fVar5 = EBML_ElementPositionData(&Element->Base);
    lVar6 = (*pcVar2)(Input,fVar5,0);
    if (lVar6 == -1) {
      return -9;
    }
    fVar5 = (Element->Base).DataSize;
    Context.Context = (Element->Base).Context;
    Context.UpContext = ParserContext;
    Context.EndPosition = EBML_ElementPositionEnd(&Element->Base);
    Context.Profile = ParserContext->Profile;
    Element_00 = (ebml_crc *)EBML_FindNextElement(Input,&Context,&UpperEltFound,local_98);
    local_90 = (ebml_crc *)0x0;
    local_58 = local_60 - 1;
    if (local_60 == 0) {
      local_58 = 0;
    }
    bVar3 = true;
    local_78 = 0;
    local_a0 = Input;
    while ((Element_00 != (ebml_crc *)0x0 && (UpperEltFound < 1))) {
      bVar7 = EBML_ElementIsFiniteSize(&Element->Base);
      if (bVar7 != 0) {
        fVar8 = EBML_ElementPositionEnd(&Element_00->Base);
        fVar9 = EBML_ElementPositionEnd(&Element->Base);
        if (fVar9 < fVar8) break;
      }
      if ((local_98 == 0) && (bVar7 = EBML_ElementIsDummy(&Element_00->Base), bVar7 != 0)) {
        EBML_ElementSkipData(&Element_00->Base,Input,&Context,(ebml_element *)0x0,0);
        NodeDelete((node *)Element_00);
        Element_00 = (ebml_crc *)0x0;
      }
      else {
        iVar1 = local_64;
        lVar6 = (**(code **)((long)(Element_00->Base).Base.Base.VMT + 0x78))
                          (Element_00,Input,&Context,local_98,local_64,local_58);
        peVar10 = local_90;
        psVar11 = local_a0;
        if (lVar6 == 0) {
          if (((iVar1 == 2) || (local_60 == 0)) || (!bVar3)) {
LAB_001063a7:
            if (peVar10 != Element_00) {
              EBML_MasterAppend(Element,&Element_00->Base);
            }
          }
          else {
            Context_00 = EBML_getContextEbmlCrc32();
            bVar7 = EBML_ElementIsType(&Element_00->Base,Context_00);
            if ((bVar7 == 0) || (peVar10 != (ebml_crc *)0x0)) {
              bVar3 = true;
              goto LAB_001063a7;
            }
            bVar7 = EBML_ElementIsFiniteSize(&Element->Base);
            if (bVar7 == 0) {
              peVar10 = (ebml_crc *)0x0;
              bVar3 = false;
              goto LAB_001063a7;
            }
            bVar7 = Node_IsPartOf(psVar11,0x534d454d);
            peVar10 = Element_00;
            if (bVar7 == 0) {
              local_88._Begin = (char *)0x0;
              local_88._Used = 0;
              fVar5 = EBML_ElementPositionEnd(&Element->Base);
              fVar8 = EBML_ElementPositionEnd(&Element_00->Base);
              if (fVar5 - fVar8 == 0xffffffffffffffff) goto LAB_00106389;
              bVar7 = ArrayResize(&local_88,fVar5 - fVar8,0);
              sVar4 = local_88._Used;
              bVar3 = false;
              if (bVar7 != 0) {
                CRCData = (uint8_t *)local_88._Begin;
                Input = (stream *)NodeCreate(Element,0x534d454d);
                local_78 = sVar4;
                if (Input != (stream *)0x0) {
                  OffSet = EBML_ElementPositionEnd(&Element_00->Base);
                  (**(code **)((long)(Input->Base).VMT + 0x20))(Input,0x100,CRCData,sVar4);
                  (**(code **)((long)(Input->Base).VMT + 0x20))(Input,0x102,&OffSet);
                  psVar11 = local_a0;
                  pcVar2 = *(code **)((long)(local_a0->Base).VMT + 0x78);
                  fVar5 = EBML_ElementPositionEnd(&Element_00->Base);
                  (*pcVar2)(psVar11,fVar5,0);
                  lVar6 = (**(code **)((long)(psVar11->Base).VMT + 0x58))(psVar11,CRCData,sVar4);
                  if (lVar6 != 0) {
                    StreamClose(Input);
                    ArrayClear(&local_88);
                    CRCData = (uint8_t *)0x0;
                    Input = psVar11;
                    peVar10 = (ebml_crc *)0x0;
                  }
                  bVar3 = false;
                  goto LAB_001063a7;
                }
                ArrayClear(&local_88);
                bVar3 = false;
                Input = local_a0;
              }
            }
            else {
              pcVar2 = *(code **)((long)(psVar11->Base).VMT + 0x78);
              fVar5 = EBML_ElementPositionEnd(&Element_00->Base);
              lVar6 = (*pcVar2)(psVar11,fVar5,0);
              (**(code **)((long)(psVar11->Base).VMT + 0x18))(psVar11,0x102,&OffSet,8);
              (**(code **)((long)(psVar11->Base).VMT + 0x18))(psVar11,0x101,&CRCData);
              CRCData = CRCData + (lVar6 - OffSet);
              fVar5 = EBML_ElementDataSize(&Element->Base,1);
              fVar8 = EBML_ElementFullSize(&Element_00->Base,1);
              local_78 = fVar5 - fVar8;
              (**(code **)((long)(psVar11->Base).VMT + 0x58))(psVar11,CRCData,local_78);
LAB_00106389:
              bVar3 = false;
            }
          }
          local_90 = peVar10;
          EBML_ElementSkipData(&Element_00->Base,Input,&Context,(ebml_element *)0x0,local_98);
          fVar5 = EBML_ElementPositionEnd(&Element->Base);
          fVar8 = EBML_ElementPositionEnd(&Element_00->Base);
          fVar5 = fVar5 - fVar8;
        }
        else {
          NodeDelete((node *)Element_00);
          Element_00 = (ebml_crc *)0x0;
        }
      }
      if (UpperEltFound < 1) {
        if (((UpperEltFound < 0) && (UpperEltFound = UpperEltFound + 1, UpperEltFound != 0)) ||
           ((bVar7 = EBML_ElementIsFiniteSize(&Element->Base), bVar7 != 0 && (fVar5 < 1)))) break;
        Element_00 = (ebml_crc *)EBML_FindNextElement(Input,&Context,&UpperEltFound,local_98);
      }
      else {
        iVar1 = UpperEltFound + -1;
        bVar12 = UpperEltFound != 1;
        UpperEltFound = iVar1;
        if ((bVar12) ||
           ((bVar7 = EBML_ElementIsFiniteSize(&Element->Base), bVar7 != 0 && (fVar5 < 1)))) break;
      }
    }
    peVar10 = local_90;
    psVar11 = local_a0;
    if (CRCData != (uint8_t *)0x0) {
      bVar7 = EBML_CRCMatches(local_90,CRCData,local_78);
      Element->CheckSumStatus = 2 - (uint)(bVar7 == 0);
      NodeDelete((node *)peVar10);
      psVar11 = local_a0;
      if (CRCData == (uint8_t *)local_88._Begin) {
        StreamClose(Input);
        ArrayClear(&local_88);
      }
    }
  }
  (Element->Base).bValueIsSet = '\x01';
  if (0 < UpperEltFound) {
    if (Element_00 == (ebml_crc *)0x0) {
      __assert_fail("SubElement!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                    ,0x1a0,
                    "err_t ReadData(ebml_master *, struct stream *, const ebml_parser_context *, bool_t, int, size_t)"
                   );
    }
    if (psVar11 == (stream *)0x0) {
      __assert_fail("(const void*)(Input)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                    ,0x1a1,
                    "err_t ReadData(ebml_master *, struct stream *, const ebml_parser_context *, bool_t, int, size_t)"
                   );
    }
    (**(code **)((long)(psVar11->Base).VMT + 0x78))(psVar11,(Element_00->Base).ElementPosition,0);
    NodeDelete((node *)Element_00);
  }
  return 0;
}

Assistant:

static err_t ReadData(ebml_crc *Element, struct stream *Input, const ebml_parser_context *UNUSED_PARAM(ParserContext), bool_t UNUSED_PARAM(AllowDummyElt), int UNUSED_PARAM(Scope), size_t UNUSED_PARAM(DepthCheckCRC))
{
    err_t Result;
    uint32_t CRCbuffer;
    Result = Stream_Read(Input,&CRCbuffer,4,NULL);
    if (Result == ERR_NONE)
    {
        Element->CRC = LOAD32LE(&CRCbuffer);
        Element->Base.bValueIsSet = 1;
    }
    return Result;
}